

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O3

uint256 * ComputeMerkleRoot(uint256 *__return_storage_ptr__,
                           vector<uint256,_std::allocator<uint256>_> hashes,bool *mutated)

{
  long lVar1;
  uchar *out;
  undefined8 uVar2;
  base_blob<256U> *pbVar3;
  ulong uVar4;
  uint256 *puVar5;
  ulong uVar6;
  undefined1 *in_RDX;
  iterator __position;
  undefined1 uVar7;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 uVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = *(uint256 **)mutated;
  __position._M_current = *(uint256 **)(mutated + 8);
  uVar8 = 0;
  uVar7 = 0;
  uVar6 = (long)__position._M_current - (long)puVar5;
  while (uVar4 = (long)uVar6 >> 5, 1 < uVar4) {
    if ((in_RDX != (undefined1 *)0x0) && (1 < uVar4)) {
      uVar9 = 1;
      uVar7 = uVar8;
      do {
        auVar13[0] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0]);
        auVar13[1] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[1] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[1]);
        auVar13[2] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[2] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[2]);
        auVar13[3] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[3] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[3]);
        auVar13[4] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[4] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[4]);
        auVar13[5] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[5] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[5]);
        auVar13[6] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[6] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[6]);
        auVar13[7] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[7] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[7]);
        auVar13[8] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[8] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[8]);
        auVar13[9] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[9] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[9]);
        auVar13[10] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[10] ==
                       (puVar5->super_base_blob<256U>).m_data._M_elems[10]);
        auVar13[0xb] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0xb] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[0xb]);
        auVar13[0xc] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0xc] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[0xc]);
        auVar13[0xd] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0xd] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[0xd]);
        auVar13[0xe] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0xe] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[0xe]);
        auVar13[0xf] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0xf] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[0xf]);
        auVar11[0] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x10] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x10]);
        auVar11[1] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x11] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x11]);
        auVar11[2] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x12] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x12]);
        auVar11[3] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x13] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x13]);
        auVar11[4] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x14] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x14]);
        auVar11[5] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x15] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x15]);
        auVar11[6] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x16] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x16]);
        auVar11[7] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x17] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x17]);
        auVar11[8] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x18] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x18]);
        auVar11[9] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x19] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x19]);
        auVar11[10] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x1a] ==
                       (puVar5->super_base_blob<256U>).m_data._M_elems[0x1a]);
        auVar11[0xb] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x1b] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[0x1b]);
        auVar11[0xc] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x1c] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[0x1c]);
        auVar11[0xd] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x1d] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[0x1d]);
        auVar11[0xe] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x1e] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[0x1e]);
        auVar11[0xf] = -(puVar5[1].super_base_blob<256U>.m_data._M_elems[0x1f] ==
                        (puVar5->super_base_blob<256U>).m_data._M_elems[0x1f]);
        auVar11 = auVar11 & auVar13;
        if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) {
          uVar7 = 1;
        }
        puVar5 = puVar5 + 2;
        uVar9 = uVar9 + 2;
        uVar8 = uVar7;
      } while (uVar9 < uVar4);
    }
    if ((uVar6 & 0x20) != 0) {
      if (__position._M_current == *(uint256 **)(mutated + 0x10)) {
        std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                  ((vector<uint256,std::allocator<uint256>> *)mutated,__position,
                   __position._M_current + -1);
        __position._M_current = *(uint256 **)(mutated + 8);
      }
      else {
        uVar10 = *(undefined8 *)__position._M_current[-1].super_base_blob<256U>.m_data._M_elems;
        uVar12 = *(undefined8 *)
                  (__position._M_current[-1].super_base_blob<256U>.m_data._M_elems + 8);
        uVar2 = *(undefined8 *)
                 (__position._M_current[-1].super_base_blob<256U>.m_data._M_elems + 0x18);
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             *(undefined8 *)(__position._M_current[-1].super_base_blob<256U>.m_data._M_elems + 0x10)
        ;
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x18) =
             uVar2;
        *(undefined8 *)((__position._M_current)->super_base_blob<256U>).m_data._M_elems = uVar10;
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 8) =
             uVar12;
        __position._M_current = (uint256 *)(*(long *)(mutated + 8) + 0x20);
        *(uint256 **)(mutated + 8) = __position._M_current;
      }
    }
    out = *(uchar **)mutated;
    SHA256D64(out,out,(ulong)((long)__position._M_current - (long)out >> 5) >> 1);
    std::vector<uint256,_std::allocator<uint256>_>::resize
              ((vector<uint256,_std::allocator<uint256>_> *)mutated,
               (ulong)(*(long *)(mutated + 8) - *(long *)mutated >> 5) >> 1);
    puVar5 = *(uint256 **)mutated;
    __position._M_current = *(uint256 **)(mutated + 8);
    uVar6 = (long)__position._M_current - (long)puVar5;
  }
  if (in_RDX != (undefined1 *)0x0) {
    *in_RDX = uVar7;
  }
  if (__position._M_current == puVar5) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0040ef99;
    uVar10 = 0;
    uVar12 = 0;
    pbVar3 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar3->m_data)._M_elems[0x10] = '\0';
    (pbVar3->m_data)._M_elems[0x11] = '\0';
    (pbVar3->m_data)._M_elems[0x12] = '\0';
    (pbVar3->m_data)._M_elems[0x13] = '\0';
    (pbVar3->m_data)._M_elems[0x14] = '\0';
    (pbVar3->m_data)._M_elems[0x15] = '\0';
    (pbVar3->m_data)._M_elems[0x16] = '\0';
    (pbVar3->m_data)._M_elems[0x17] = '\0';
    (pbVar3->m_data)._M_elems[0x18] = '\0';
    (pbVar3->m_data)._M_elems[0x19] = '\0';
    (pbVar3->m_data)._M_elems[0x1a] = '\0';
    (pbVar3->m_data)._M_elems[0x1b] = '\0';
    (pbVar3->m_data)._M_elems[0x1c] = '\0';
    (pbVar3->m_data)._M_elems[0x1d] = '\0';
    (pbVar3->m_data)._M_elems[0x1e] = '\0';
    (pbVar3->m_data)._M_elems[0x1f] = '\0';
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_0040ef99:
      __stack_chk_fail();
    }
    uVar10 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
    uVar12 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
    uVar2 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar2;
  }
  *(undefined8 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = uVar10;
  *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) = uVar12;
  return __return_storage_ptr__;
}

Assistant:

uint256 ComputeMerkleRoot(std::vector<uint256> hashes, bool* mutated) {
    bool mutation = false;
    while (hashes.size() > 1) {
        if (mutated) {
            for (size_t pos = 0; pos + 1 < hashes.size(); pos += 2) {
                if (hashes[pos] == hashes[pos + 1]) mutation = true;
            }
        }
        if (hashes.size() & 1) {
            hashes.push_back(hashes.back());
        }
        SHA256D64(hashes[0].begin(), hashes[0].begin(), hashes.size() / 2);
        hashes.resize(hashes.size() / 2);
    }
    if (mutated) *mutated = mutation;
    if (hashes.size() == 0) return uint256();
    return hashes[0];
}